

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O3

Aig_Obj_t *
Dar_BalanceBuildSuperTop
          (Aig_Man_t *p,Vec_Ptr_t *vSuper,Aig_Type_t Type,int fUpdateLevel,int nLutSize)

{
  bool bVar1;
  int iVar2;
  Vec_Ptr_t *vSuper_00;
  void **ppvVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  
  if ((long)vSuper->nSize < 2) {
    __assert_fail("vSuper->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                  ,0x1cf,
                  "Aig_Obj_t *Dar_BalanceBuildSuperTop(Aig_Man_t *, Vec_Ptr_t *, Aig_Type_t, int, int)"
                 );
  }
  qsort(vSuper->pArray,(long)vSuper->nSize,8,Aig_NodeCompareLevelsDecrease);
  iVar12 = vSuper->nSize;
  if (1 < iVar12) {
    uVar9 = 8;
    if (6 < nLutSize - 1U) {
      uVar9 = (ulong)(uint)nLutSize;
    }
    iVar8 = (int)uVar9;
    do {
      vSuper_00 = (Vec_Ptr_t *)malloc(0x10);
      vSuper_00->nSize = 0;
      vSuper_00->nCap = iVar8;
      if (iVar8 == 0) {
        ppvVar3 = (void **)0x0;
      }
      else {
        ppvVar3 = (void **)malloc((long)iVar8 << 3);
      }
      vSuper_00->pArray = ppvVar3;
      uVar7 = (ulong)(iVar12 - 1);
      iVar13 = 0;
      uVar5 = 0;
      uVar11 = uVar9;
      do {
        if (vSuper->nSize < iVar12) goto LAB_0048e10e;
        pAVar4 = (Aig_Obj_t *)vSuper->pArray[uVar7];
        iVar2 = Aig_BaseSize(p,pAVar4,nLutSize);
        iVar13 = iVar13 + iVar2;
        if (nLutSize < iVar13 && 1 < (uint)uVar5) {
          uVar6 = uVar5 & 0xffffffff;
          break;
        }
        uVar10 = (uint)uVar11;
        if ((uint)uVar5 == uVar10) {
          if ((int)uVar10 < 0x10) {
            if (vSuper_00->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(vSuper_00->pArray,0x80);
            }
            vSuper_00->pArray = ppvVar3;
            vSuper_00->nCap = 0x10;
            uVar11 = 0x10;
          }
          else {
            uVar11 = (ulong)(uVar10 * 2);
            if (vSuper_00->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(uVar11 * 8);
            }
            else {
              ppvVar3 = (void **)realloc(vSuper_00->pArray,uVar11 * 8);
            }
            vSuper_00->pArray = ppvVar3;
            vSuper_00->nCap = uVar10 * 2;
          }
        }
        else {
          ppvVar3 = vSuper_00->pArray;
        }
        uVar6 = uVar5 + 1;
        vSuper_00->nSize = (int)uVar6;
        ppvVar3[uVar5] = pAVar4;
        uVar7 = uVar7 - 1;
        bVar1 = 1 < iVar12;
        uVar5 = uVar6;
        iVar12 = iVar12 + -1;
      } while (bVar1);
      vSuper->nSize = vSuper->nSize - (int)uVar6;
      pAVar4 = Dar_BalanceBuildSuper(p,vSuper_00,Type,fUpdateLevel);
      if (vSuper_00->pArray != (void **)0x0) {
        free(vSuper_00->pArray);
      }
      free(vSuper_00);
      Dar_BalancePushUniqueOrderByLevel(vSuper,pAVar4,(uint)(Type == AIG_OBJ_EXOR));
      iVar12 = vSuper->nSize;
    } while (1 < iVar12);
  }
  if (iVar12 == 1) {
    return (Aig_Obj_t *)*vSuper->pArray;
  }
LAB_0048e10e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Obj_t * Dar_BalanceBuildSuperTop( Aig_Man_t * p, Vec_Ptr_t * vSuper, Aig_Type_t Type, int fUpdateLevel, int nLutSize )
{
    Vec_Ptr_t * vSubset;
    Aig_Obj_t * pObj;
    int i, nBaseSizeAll, nBaseSize;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Aig_NodeCompareLevelsDecrease );
    // add one LUT at a time
    while ( Vec_PtrSize(vSuper) > 1 )
    {
        // isolate the group of nodes with nLutSize inputs
        nBaseSizeAll = 0;
        vSubset = Vec_PtrAlloc( nLutSize );
        Vec_PtrForEachEntryReverse( Aig_Obj_t *, vSuper, pObj, i )
        {
            nBaseSize = Aig_BaseSize( p, pObj, nLutSize );
            if ( nBaseSizeAll + nBaseSize > nLutSize && Vec_PtrSize(vSubset) > 1 )
                break;
            nBaseSizeAll += nBaseSize;
            Vec_PtrPush( vSubset, pObj );
        }
        // remove them from vSuper
        Vec_PtrShrink( vSuper, Vec_PtrSize(vSuper) - Vec_PtrSize(vSubset) );
        // create the new supergate
        pObj = Dar_BalanceBuildSuper( p, vSubset, Type, fUpdateLevel );
        Vec_PtrFree( vSubset );
        // add the new output
        Dar_BalancePushUniqueOrderByLevel( vSuper, pObj, Type == AIG_OBJ_EXOR );
    }
    return (Aig_Obj_t *)Vec_PtrEntry(vSuper, 0);
}